

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  bool bVar1;
  cmDynamicLoaderCache *pcVar2;
  LibraryHandle pvVar3;
  LibraryHandle lh;
  allocator local_41;
  LibraryHandle local_40;
  string local_38;
  
  pcVar2 = cmDynamicLoaderCache::GetInstance();
  bVar1 = cmDynamicLoaderCache::GetCacheFile(pcVar2,libname,&local_40);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_38,libname,&local_41);
    pvVar3 = cmsys::DynamicLoader::OpenLibrary(&local_38);
    local_40 = pvVar3;
    std::__cxx11::string::~string((string *)&local_38);
    pcVar2 = cmDynamicLoaderCache::GetInstance();
    cmDynamicLoaderCache::CacheFile(pcVar2,libname,&local_40);
    local_40 = pvVar3;
  }
  return local_40;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname )
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if ( cmDynamicLoaderCache::GetInstance()->GetCacheFile(libname, lh) )
    {
    return lh;
    }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance()->CacheFile(libname, lh);
  return lh;
}